

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

void tcu::decompress(PixelBufferAccess *dst,CompressedTexFormat fmt,deUint8 *src,
                    TexDecompressionParams *params)

{
  int i;
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i_2;
  int height;
  int depth;
  int width;
  int local_150;
  PixelBufferAccess blockAccess;
  IVec3 dstPixelPos;
  IVec3 blockPos;
  IVec3 blockPitches;
  Vector<int,_3> res;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBlock;
  IVec3 blockPixelSize;
  EVP_PKEY_CTX local_58 [40];
  
  iVar1 = getBlockSize(fmt);
  getBlockPixelSize((tcu *)&blockPixelSize,fmt);
  iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar6 = (iVar2 / blockPixelSize.m_data[0] + 1) - (uint)(iVar2 % blockPixelSize.m_data[0] == 0);
  iVar4 = (iVar4 / blockPixelSize.m_data[1] + 1) - (uint)(iVar4 % blockPixelSize.m_data[1] == 0);
  iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  iVar5 = (iVar2 / blockPixelSize.m_data[2] + 1) - (uint)(iVar2 % blockPixelSize.m_data[2] == 0);
  blockPitches.m_data[1] = iVar6 * iVar1;
  blockPitches.m_data[2] = iVar4 * blockPitches.m_data[1];
  blockPitches.m_data[0] = iVar1;
  iVar2 = TextureFormat::getPixelSize((TextureFormat *)dst);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&uncompressedBlock,
             (long)(iVar2 * blockPixelSize.m_data[2] *
                   blockPixelSize.m_data[1] * blockPixelSize.m_data[0]),
             (allocator_type *)&blockAccess);
  res.m_data._0_8_ = getUncompressedFormat(fmt);
  PixelBufferAccess::PixelBufferAccess
            (&blockAccess,(TextureFormat *)&res,blockPixelSize.m_data[0],blockPixelSize.m_data[1],
             blockPixelSize.m_data[2],
             uncompressedBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if (0 < iVar5) {
    iVar2 = 0;
    do {
      if (0 < iVar4) {
        local_150 = 0;
        do {
          if (0 < iVar6) {
            iVar1 = 0;
            do {
              blockPos.m_data[0] = iVar1;
              blockPos.m_data[1] = local_150;
              blockPos.m_data[2] = iVar2;
              res.m_data[2] = 0;
              res.m_data[0] = 0;
              res.m_data[1] = 0;
              lVar3 = 0;
              do {
                res.m_data[lVar3] = blockPitches.m_data[lVar3] * blockPos.m_data[lVar3];
                lVar3 = lVar3 + 1;
              } while (lVar3 != 3);
              width = (dst->super_ConstPixelBufferAccess).m_size.m_data[0] -
                      iVar1 * blockPixelSize.m_data[0];
              height = (dst->super_ConstPixelBufferAccess).m_size.m_data[1] -
                       local_150 * blockPixelSize.m_data[1];
              depth = (dst->super_ConstPixelBufferAccess).m_size.m_data[2] -
                      iVar2 * blockPixelSize.m_data[2];
              dstPixelPos.m_data[2] = 0;
              dstPixelPos.m_data[0] = 0;
              dstPixelPos.m_data[1] = 0;
              lVar3 = 0;
              do {
                dstPixelPos.m_data[lVar3] = blockPixelSize.m_data[lVar3] * blockPos.m_data[lVar3];
                lVar3 = lVar3 + 1;
              } while (lVar3 != 3);
              if (blockPixelSize.m_data[0] < width) {
                width = blockPixelSize.m_data[0];
              }
              if (blockPixelSize.m_data[1] < height) {
                height = blockPixelSize.m_data[1];
              }
              if (blockPixelSize.m_data[2] < depth) {
                depth = blockPixelSize.m_data[2];
              }
              if (fmt - COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA < 0x1c) {
                astc::decompress(&blockAccess,src + (res.m_data[1] + res.m_data[0] + res.m_data[2]),
                                 fmt,params->astcMode);
              }
              else if (fmt < COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA) {
                (*(code *)(&DAT_009e6bb0 + *(int *)(&DAT_009e6bb0 + (ulong)fmt * 4)))();
                return;
              }
              getSubregion((PixelBufferAccess *)&res,dst,dstPixelPos.m_data[0],dstPixelPos.m_data[1]
                           ,dstPixelPos.m_data[2],width,height,depth);
              getSubregion((PixelBufferAccess *)local_58,&blockAccess,0,0,0,width,height,depth);
              copy((EVP_PKEY_CTX *)&res,local_58);
              iVar1 = iVar1 + 1;
            } while (iVar1 != iVar6);
          }
          local_150 = local_150 + 1;
        } while (local_150 != iVar4);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar5);
  }
  if (uncompressedBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uncompressedBlock.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)uncompressedBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)uncompressedBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, CompressedTexFormat fmt, const deUint8* src, const TexDecompressionParams& params)
{
	const int				blockSize			= getBlockSize(fmt);
	const IVec3				blockPixelSize		(getBlockPixelSize(fmt));
	const IVec3				blockCount			(deDivRoundUp32(dst.getWidth(),		blockPixelSize.x()),
												 deDivRoundUp32(dst.getHeight(),	blockPixelSize.y()),
												 deDivRoundUp32(dst.getDepth(),		blockPixelSize.z()));
	const IVec3				blockPitches		(blockSize, blockSize * blockCount.x(), blockSize * blockCount.x() * blockCount.y());

	std::vector<deUint8>	uncompressedBlock	(dst.getFormat().getPixelSize() * blockPixelSize.x() * blockPixelSize.y() * blockPixelSize.z());
	const PixelBufferAccess	blockAccess			(getUncompressedFormat(fmt), blockPixelSize.x(), blockPixelSize.y(), blockPixelSize.z(), &uncompressedBlock[0]);

	DE_ASSERT(dst.getFormat() == getUncompressedFormat(fmt));

	for (int blockZ = 0; blockZ < blockCount.z(); blockZ++)
	for (int blockY = 0; blockY < blockCount.y(); blockY++)
	for (int blockX = 0; blockX < blockCount.x(); blockX++)
	{
		const IVec3				blockPos	(blockX, blockY, blockZ);
		const deUint8* const	blockPtr	= src + componentSum(blockPos * blockPitches);
		const IVec3				copySize	(de::min(blockPixelSize.x(), dst.getWidth()		- blockPos.x() * blockPixelSize.x()),
											 de::min(blockPixelSize.y(), dst.getHeight()	- blockPos.y() * blockPixelSize.y()),
											 de::min(blockPixelSize.z(), dst.getDepth()		- blockPos.z() * blockPixelSize.z()));
		const IVec3				dstPixelPos	= blockPos * blockPixelSize;

		decompressBlock(fmt, blockAccess, blockPtr, params);

		copy(getSubregion(dst, dstPixelPos.x(), dstPixelPos.y(), dstPixelPos.z(), copySize.x(), copySize.y(), copySize.z()), getSubregion(blockAccess, 0, 0, 0, copySize.x(), copySize.y(), copySize.z()));
	}
}